

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

int N_VLinearCombination(int nvec,realtype *c,N_Vector *X,N_Vector z)

{
  long in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  int in_EDI;
  int ier;
  int i;
  int local_28;
  int local_24;
  
  if (*(long *)(*(long *)(in_RCX + 8) + 0xe8) == 0) {
    (**(code **)(*(long *)(in_RCX + 8) + 0x70))(*in_RSI,*in_RDX,in_RCX);
    for (local_24 = 1; local_24 < in_EDI; local_24 = local_24 + 1) {
      (**(code **)(*(long *)(in_RCX + 8) + 0x50))
                (in_RSI[local_24],0x3ff0000000000000,in_RDX[local_24],in_RCX,in_RCX);
    }
    local_28 = 0;
  }
  else {
    local_28 = (**(code **)(*(long *)(in_RCX + 8) + 0xe8))(in_EDI,in_RSI,in_RDX,in_RCX);
  }
  return local_28;
}

Assistant:

int N_VLinearCombination(int nvec, realtype* c, N_Vector* X, N_Vector z)
{
  int i, ier;
  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(X[0]));

  if (z->ops->nvlinearcombination != NULL) {

    ier = z->ops->nvlinearcombination(nvec, c, X, z);

  } else {

    z->ops->nvscale(c[0], X[0], z);
    for (i=1; i<nvec; i++) {
      z->ops->nvlinearsum(c[i], X[i], RCONST(1.0), z, z);
    }
    ier = 0;

  }

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(X[0]));
  return(ier);
}